

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall
kratos::InstantiationStmt::process_port
          (InstantiationStmt *this,Port *port,Generator *parent,string *target_name)

{
  AssignStmt *pAVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VarException *pVVar3;
  InternalException *pIVar4;
  undefined8 uVar5;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<kratos::Port_*const,_kratos::Var_*>_>,_bool> pVar6;
  pair<std::_Rb_tree_iterator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_bool> pVar7;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  undefined1 local_d0 [32];
  undefined1 local_b0 [56];
  string local_78;
  undefined1 local_58 [32];
  Port *local_38;
  Port *port_local;
  
  local_38 = port;
  if (port->direction_ == Out) {
    filter_slice_pairs_with_target
              ((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                *)&local_78,&(port->super_Var).slices_,parent,true);
    iVar2 = (*(local_38->super_Var).super_IRNode._vptr_IRNode[0xe])();
    filter_assignments_with_target
              ((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)local_b0,
               (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var_00,iVar2),parent,true);
    if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._0_8_ = local_58 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "Output slices not supported in the statement. Please run a de-couple pass first",
                 "");
      InternalException::InternalException(pIVar4,(string *)local_58);
      __cxa_throw(pIVar4,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_b0._24_8_ != 0) {
      if (local_b0._24_8_ != 1) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,
                   "Multiple outputs not supported in the statement. Please run a de-couple pass first"
                   ,"");
        InternalException::InternalException(pIVar4,(string *)local_58);
        __cxa_throw(pIVar4,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      pAVar1 = (AssignStmt *)((_Hash_node_base *)(local_b0._16_8_ + 8))->_M_nxt;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((_Hash_node_base *)(local_b0._16_8_ + 0x10))->_M_nxt;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<kratos::Port*,std::pair<kratos::Port*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Port*const,kratos::Var*>>,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
      ::_M_emplace_unique<kratos::Port*&,kratos::Var*&>
                ((_Rb_tree<kratos::Port*,std::pair<kratos::Port*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Port*const,kratos::Var*>>,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
                  *)&this->port_mapping_,&local_38,&pAVar1->left_);
      (*(code *)((_Hash_node_base *)(pAVar1->super_Stmt).super_IRNode._vptr_IRNode)[9]._M_nxt)
                (pAVar1);
      if (parent->debug == true) {
        local_58._0_8_ = pAVar1;
        std::
        _Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Stmt*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Stmt*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
        ::_M_emplace_unique<kratos::Port*&,kratos::AssignStmt*>
                  ((_Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Stmt*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Stmt*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
                    *)&this->port_debug_,&local_38,(AssignStmt **)local_58);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_b0);
    this_01 = &local_78;
  }
  else {
    if (port->direction_ != In) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Inout port type not implemented","");
      InternalException::InternalException(pIVar4,(string *)local_b0);
      __cxa_throw(pIVar4,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    filter_slice_pairs_with_target
              ((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                *)local_d0,&(port->super_Var).slices_,parent,false);
    iVar2 = (*(local_38->super_Var).super_IRNode._vptr_IRNode[0x10])();
    filter_assignments_with_target
              ((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)local_b0,
               (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var,iVar2),parent,false);
    if (local_d0._0_8_ != local_d0._8_8_) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._0_8_ = local_58 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "Input slices not supported in the statement. Please run a de-couple pass first",""
                );
      InternalException::InternalException(pIVar4,(string *)local_58);
      __cxa_throw(pIVar4,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_b0._24_8_ != 1) {
      if (local_b0._24_8_ == 0) {
        pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
        local_58._0_8_ = (target_name->_M_dataplus)._M_p;
        local_58._8_8_ = target_name->_M_string_length;
        local_58._16_8_ = (port->super_Var).name._M_dataplus._M_p;
        local_58._24_8_ = (port->super_Var).name._M_string_length;
        format_str.size_ = 0xdd;
        format_str.data_ = (char *)0x18;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_58;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_78,(detail *)"{0}.{1} is not connected",format_str,args);
        local_d0._24_8_ = local_38;
        __l._M_len = 1;
        __l._M_array = (iterator)(local_d0 + 0x18);
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_58,__l,(allocator_type *)((long)&port_local + 7));
        VarException::VarException
                  (pVVar3,&local_78,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   local_58);
        __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
      local_58._0_8_ = (target_name->_M_dataplus)._M_p;
      local_58._8_8_ = target_name->_M_string_length;
      local_58._16_8_ = (port->super_Var).name._M_dataplus._M_p;
      local_58._24_8_ = (port->super_Var).name._M_string_length;
      format_str_00.size_ = 0xdd;
      format_str_00.data_ = (char *)0x22;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_78,(detail *)"{0}.{1} is driven by multiple nets",format_str_00,args_00);
      local_d0._24_8_ = local_38;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)(local_d0 + 0x18);
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58
                 ,__l_00,(allocator_type *)((long)&port_local + 7));
      VarException::VarException
                (pVVar3,&local_78,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_58
                );
      __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar6 = std::
            _Rb_tree<kratos::Port*,std::pair<kratos::Port*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Port*const,kratos::Var*>>,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
            ::_M_emplace_unique<kratos::Port*&,kratos::Var*&>
                      ((_Rb_tree<kratos::Port*,std::pair<kratos::Port*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Port*const,kratos::Var*>>,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
                        *)&this->port_mapping_,&local_38,
                       (Var **)(((_Hash_node_base *)(local_b0._16_8_ + 8))->_M_nxt + 0x19));
    uVar5 = pVar6._8_8_;
    if (parent->debug == true) {
      local_58._0_8_ = ((_Hash_node_base *)(local_b0._16_8_ + 8))->_M_nxt;
      pVar7 = std::
              _Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Stmt*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Stmt*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
              ::_M_emplace_unique<kratos::Port*&,kratos::AssignStmt*>
                        ((_Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Stmt*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Stmt*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
                          *)&this->port_debug_,&local_38,(AssignStmt **)local_58);
      uVar5 = pVar7._8_8_;
    }
    local_58._0_8_ = ((_Hash_node_base *)(local_b0._16_8_ + 8))->_M_nxt;
    std::
    _Hashtable<kratos::AssignStmt*,kratos::AssignStmt*,std::allocator<kratos::AssignStmt*>,std::__detail::_Identity,std::equal_to<kratos::AssignStmt*>,std::hash<kratos::AssignStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<kratos::AssignStmt*>
              ((_Hashtable<kratos::AssignStmt*,kratos::AssignStmt*,std::allocator<kratos::AssignStmt*>,std::__detail::_Identity,std::equal_to<kratos::AssignStmt*>,std::hash<kratos::AssignStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->connection_stmt_,local_58,uVar5);
    (*(code *)((_Hash_node_base *)(local_b0._16_8_ + 8))->_M_nxt->_M_nxt[9]._M_nxt)();
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_b0);
    this_01 = (string *)local_d0;
  }
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           *)this_01);
  return;
}

Assistant:

void InstantiationStmt::process_port(kratos::Port *port, Generator *parent,
                                     const std::string &target_name) {
    auto const port_direction = port->port_direction();
    auto const &port_name = port->name;
    if (port_direction == PortDirection::In) {
        // if we're connected to a base variable and no slice, we are good
        const auto &slices = filter_slice_pairs_with_target(port->get_slices(), parent, false);
        const auto &sources = filter_assignments_with_target(port->sources(), parent, false);
        // because an input cannot be an register, it can only has one
        // source (all bits combined)
        if (slices.empty()) {
            if (sources.empty())
                throw VarException(::format("{0}.{1} is not connected", target_name, port_name),
                                   {port});
            if (sources.size() > 1)
                throw VarException(
                    ::format("{0}.{1} is driven by multiple nets", target_name, port_name), {port});
            // add it to the port mapping and we are good to go
            auto const &stmt = *sources.begin();
            port_mapping_.emplace(port, stmt->right());
            if (parent->debug) {
                port_debug_.emplace(port, stmt.get());
            }
            // add it to the mapping list
            connection_stmt_.emplace(stmt.get());
            // remove it from the parent
            stmt->remove_from_parent();
        } else {
            // you need to run a de-slice pass on the module references first
            throw InternalException(
                "Input slices not supported in the statement. "
                "Please run a de-couple pass first");
        }
    } else if (port_direction == PortDirection::Out) {
        // need to find out if there is any sources connected to the slices
        const auto &slices = filter_slice_pairs_with_target(port->get_slices(), parent, true);
        const auto &sinks = filter_assignments_with_target(port->sinks(), parent, true);
        if (slices.empty()) {
            if (!sinks.empty() && sinks.size() == 1) {
                auto stmt = *sinks.begin();
                port_mapping_.emplace(port, stmt->left());
                stmt->remove_from_parent();
                if (parent->debug) {
                    port_debug_.emplace(port, stmt.get());
                }
            } else if (!sinks.empty() && sinks.size() > 1) {
                throw InternalException(
                    "Multiple outputs not supported in the statement. "
                    "Please run a de-couple pass first");
            }
        } else {
            throw InternalException(
                "Output slices not supported in the statement. "
                "Please run a de-couple pass first");
        }
    } else {
        throw InternalException("Inout port type not implemented");
    }
}